

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O3

bool __thiscall ON_PolylineCurve::ChangeClosedCurveSeam(ON_PolylineCurve *this,double t)

{
  double t1;
  ON_3dPoint *pOVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  double *pdVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  double dVar9;
  double k;
  ON_Interval old_dom;
  ON_SimpleArray<double> new_t;
  ON_SimpleArray<ON_3dPoint> new_pt;
  ON_3dPoint new_start;
  ON_Interval span_domain;
  double local_d8;
  double local_c8;
  ON_Interval local_c0;
  ON_SimpleArray<double> local_b0;
  ON_SimpleArray<ON_3dPoint> local_98;
  ulong local_80;
  ON_3dPoint local_78;
  ON_Interval local_58;
  ON_SimpleArray<ON_3dPoint> local_48;
  
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])(this);
  if ((char)iVar3 == '\0') {
LAB_005906fa:
    bVar2 = false;
  }
  else {
    local_c8 = t;
    bVar2 = ON_Interval::Includes(&local_c0,t,false);
    local_d8 = t;
    if (!bVar2) {
      dVar9 = ON_Interval::NormalizedParameterAt(&local_c0,t);
      dVar9 = fmod(dVar9,1.0);
      local_d8 = ON_Interval::ParameterAt
                           (&local_c0,
                            (double)(~-(ulong)(dVar9 < 0.0) & (ulong)dVar9 |
                                    (ulong)(dVar9 + 1.0) & -(ulong)(dVar9 < 0.0)));
      local_c8 = local_d8;
    }
    bVar2 = ON_Interval::Includes(&local_c0,local_d8,true);
    if (bVar2) {
      iVar3 = ON_Polyline::PointCount(&this->m_pline);
      uVar4 = ON_NurbsSpanIndex(2,iVar3,(this->m_t).m_a,local_d8,0,0);
      pdVar5 = (this->m_t).m_a;
      dVar9 = pdVar5[(int)uVar4];
      if ((local_d8 < dVar9) || (t1 = pdVar5[(long)(int)uVar4 + 1], t1 <= local_d8))
      goto LAB_005906fa;
      ON_Interval::ON_Interval(&local_58,dVar9,t1);
      dVar9 = ON_Interval::NormalizedParameterAt(&local_58,local_d8);
      if (dVar9 <= 1.7763568394002505e-15) {
        pdVar5 = ON_Interval::operator[](&local_58,0);
        local_d8 = *pdVar5;
        local_c8 = local_d8;
      }
      else if (0.9999999999999982 <= dVar9) {
        pdVar5 = ON_Interval::operator[](&local_58,1);
        local_d8 = *pdVar5;
        local_c8 = local_d8;
        uVar4 = ON_NurbsSpanIndex(2,iVar3,(this->m_t).m_a,local_d8,0,0);
      }
      dVar9 = ON_Interval::operator[](&local_c0,0);
      if ((local_d8 != dVar9) || (NAN(local_d8) || NAN(dVar9))) {
        dVar9 = ON_Interval::operator[](&local_c0,1);
        if ((local_d8 != dVar9) || (NAN(local_d8) || NAN(dVar9))) {
          pdVar5 = (this->m_t).m_a;
          uVar7 = -(uint)(pdVar5[(int)uVar4] != local_d8) & 1;
          local_80 = (ulong)uVar7;
          local_98._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808fd0;
          local_98.m_a = (ON_3dPoint *)0x0;
          local_98.m_count = 0;
          local_98.m_capacity = 0;
          iVar6 = iVar3 + uVar7;
          if (iVar6 == 0) {
            local_b0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
            local_b0.m_a = (double *)0x0;
            local_b0.m_count = 0;
            local_b0.m_capacity = 0;
          }
          else {
            ON_SimpleArray<ON_3dPoint>::SetCapacity(&local_98,(long)iVar6);
            local_b0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
            local_b0.m_a = (double *)0x0;
            local_b0.m_count = 0;
            local_b0.m_capacity = 0;
            ON_SimpleArray<double>::SetCapacity(&local_b0,(long)iVar6);
            pdVar5 = (this->m_t).m_a;
          }
          if ((local_d8 != pdVar5[(int)uVar4]) || (NAN(local_d8) || NAN(pdVar5[(int)uVar4]))) {
            ON_Curve::PointAt(&local_78,&this->super_ON_Curve,local_d8);
          }
          else {
            pOVar1 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
            local_78.z = pOVar1[(int)uVar4].z;
            pOVar1 = pOVar1 + (int)uVar4;
            local_78.x = pOVar1->x;
            local_78.y = pOVar1->y;
          }
          ON_SimpleArray<ON_3dPoint>::Append(&local_98,&local_78);
          ON_SimpleArray<double>::Append(&local_b0,&local_c8);
          ON_SimpleArray<ON_3dPoint>::Append
                    (&local_98,iVar3 + ~uVar4,
                     (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a +
                     (long)(int)uVar4 + 1);
          ON_SimpleArray<double>::Append
                    (&local_b0,iVar3 + ~uVar4,(this->m_t).m_a + (long)(int)uVar4 + 1);
          iVar3 = local_b0.m_count;
          lVar8 = (long)local_b0.m_count;
          iVar6 = uVar4 + (int)local_80 + -1;
          ON_SimpleArray<ON_3dPoint>::Append
                    (&local_98,iVar6,
                     (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a + 1)
          ;
          ON_SimpleArray<double>::Append(&local_b0,iVar6,(this->m_t).m_a + 1);
          ON_SimpleArray<ON_3dPoint>::Append(&local_98,&local_78);
          ON_SimpleArray<double>::Append(&local_b0,&local_c8);
          dVar9 = ON_Interval::Length(&local_c0);
          if (iVar3 < local_b0.m_count) {
            do {
              local_b0.m_a[lVar8] = local_b0.m_a[lVar8] + dVar9;
              lVar8 = lVar8 + 1;
            } while (local_b0.m_count != lVar8);
          }
          ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_48,&local_98);
          ON_Polyline::operator=(&this->m_pline,(ON_3dPointArray *)&local_48);
          ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_48);
          ON_SimpleArray<double>::operator=(&this->m_t,&local_b0);
          ON_SimpleArray<double>::~ON_SimpleArray(&local_b0);
          ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_98);
        }
      }
    }
    dVar9 = ON_Interval::operator[](&local_c0,0);
    if ((dVar9 != t) || (NAN(dVar9) || NAN(t))) {
      dVar9 = ON_Interval::Length(&local_c0);
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (t,dVar9 + t,this);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool ON_PolylineCurve::ChangeClosedCurveSeam( double t )
{
  const ON_Interval old_dom = Domain();
  bool rc = IsClosed();
  if ( rc )
  {
    double k = t;

    if ( !old_dom.Includes(t) )
    {
      // If you know why this is here, please add
      // a bug reference so we can retest when this code
      // is cleaned up.  It needs to be cleaned up.
      double s = old_dom.NormalizedParameterAt(t);
      s = fmod(s,1.0);
      if ( s < 0.0 )
        s += 1.0;
      k = old_dom.ParameterAt(s);
    }



    if ( old_dom.Includes(k,true) )
    {
      int old_count = PointCount();
      int i = ON_NurbsSpanIndex(2,old_count,m_t.Array(),k,0,0);
      if ( k < m_t[i] )
        return false;
      if ( k >= m_t[i+1] )
        return false;

      // 20 Feb 2014 Dale L & Lowell - This was making a new point in the polyline
      // when the seam was changed to a t within eps of an existing point.
      // This change snaps the t to existing points if it is within normalized_span_tol
      // of one that already exists. ON_EPSILON didn't quite work but 8 * ON_EPSILON does
      // comparing t = 4149.8519999999990 to m_t[1] = 4149.8519999999980 in RH-24591
      ON_Interval span_domain(m_t[i],m_t[i+1]);
      double s = span_domain.NormalizedParameterAt(k);
      double normalized_span_tol = 8.0*ON_EPSILON;
      if ( s <= normalized_span_tol )
      {
        k = span_domain[0];
      }
      else if ( s >= 1.0 - normalized_span_tol )
      {
        k = span_domain[1];
        i = ON_NurbsSpanIndex(2,old_count,m_t.Array(),k,0,0);
      }

      if ( k == old_dom[0] || k == old_dom[1] )
      {
        // k already at start end of this curve
        rc = true;
      }
      else
      {
        int new_count = (k==m_t[i]) ? old_count : old_count+1;
        ON_SimpleArray<ON_3dPoint> new_pt(new_count);
        ON_SimpleArray<double> new_t(new_count);
        ON_3dPoint new_start = (k==m_t[i]) ? m_pline[i] : PointAt(k);
        new_pt.Append( new_start );
        new_t.Append(k);
        int n = old_count-i-1;
        new_pt.Append( n, m_pline.Array() + i+1 );
        new_t.Append( n, m_t.Array() + i+1 );
      
        int j = new_t.Count();

        n = new_count-old_count+i-1;
        new_pt.Append( n, m_pline.Array() + 1 );
        new_t.Append(  n, m_t.Array() + 1 );

        new_pt.Append( new_start );
        new_t.Append(k);

        double d = old_dom.Length();
        while ( j  < new_t.Count() )
        {
          new_t[j] += d;
          j++;
        }

        m_pline = new_pt;
        m_t = new_t;
      }
    }
    else
    {
      // k already at start end of this curve
      rc = true;
    }

    if ( rc  && t != old_dom[0] )
      SetDomain( t, t + old_dom.Length() );
  }
  return rc;
}